

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O3

void __thiscall QHstsStore::synchronize(QHstsStore *this)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  add_const_t<QList<QHstsPolicy>_> *__range2;
  QHstsPolicy *policy;
  QHstsPolicy *this_00;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QByteArrayView QVar6;
  QString local_a0;
  QString local_88;
  QArrayData *local_70 [3];
  QArrayData *local_58;
  undefined1 *puStack_50;
  storage_type *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QSettings::isWritable();
  if (cVar1 != '\0') {
    if ((this->observedPolicies).d.size != 0) {
      QVar4.m_size = (size_t)"StrictTransportSecurity";
      QVar4.field_0.m_data = &this->store;
      QSettings::beginGroup(QVar4);
      QVar5.m_size = (size_t)"Policies";
      QVar5.field_0.m_data = &this->store;
      QSettings::beginGroup(QVar5);
      lVar3 = (this->observedPolicies).d.size;
      if (lVar3 != 0) {
        this_00 = (this->observedPolicies).d.ptr;
        lVar3 = lVar3 << 3;
        do {
          local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QHstsPolicy::host(&local_a0,this_00,(ComponentFormattingOptions)0x7f00000);
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          QString::toUtf8_helper((QString *)local_70);
          QByteArray::toHex((char)&local_58);
          if (local_70[0] != (QArrayData *)0x0) {
            LOCK();
            (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_70[0],1,0x10);
            }
          }
          QVar6.m_data = local_48;
          QVar6.m_size = (qsizetype)&local_88;
          QString::fromLatin1(QVar6);
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,1,0x10);
            }
          }
          if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
            }
          }
          bVar2 = QHstsPolicy::isExpired(this_00);
          if (bVar2) {
LAB_001d85aa:
            evictPolicy(this,&local_88);
          }
          else {
            bVar2 = serializePolicy(this,&local_88,this_00);
            if (!bVar2) goto LAB_001d85aa;
          }
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
            }
          }
          this_00 = this_00 + 1;
          lVar3 = lVar3 + -8;
        } while (lVar3 != 0);
      }
      QList<QHstsPolicy>::clear(&this->observedPolicies);
      QSettings::endGroup();
      QSettings::endGroup();
    }
    QSettings::sync();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHstsStore::synchronize()
{
    if (!isWritable())
        return;

    if (observedPolicies.size()) {
        beginHstsGroups();
        for (const QHstsPolicy &policy : std::as_const(observedPolicies)) {
            const QString key(host_name_to_settings_key(policy.host()));
            // If we fail to write a new, updated policy, we also remove the old one.
            if (policy.isExpired() || !serializePolicy(key, policy))
                evictPolicy(key);
        }
        observedPolicies.clear();
        endHstsGroups();
    }

    store.sync();
}